

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void acquireMonitor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if ((window->wl).libdecor.frame == (libdecor_frame *)0x0) {
    if ((window->wl).xdg.toplevel != (xdg_toplevel *)0x0) {
      xdg_toplevel_set_fullscreen((window->wl).xdg.toplevel,(window->monitor->wl).output);
    }
  }
  else {
    (*_glfw.wl.libdecor.libdecor_frame_set_fullscreen_)
              ((window->wl).libdecor.frame,(window->monitor->wl).output);
  }
  setIdleInhibitor(window,1);
  if ((window->wl).fallback.decorations != 0) {
    destroyFallbackDecorations(window);
  }
  return;
}

Assistant:

static void acquireMonitor(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwGetMonitorPosX11(window->monitor, &xpos, &ypos);
        _glfwGetVideoModeX11(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindow(window->monitor, window);
}